

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O2

Vec_Int_t * Gia_ManCollectPath(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Vec_Int_t *vPath;
  ulong uVar1;
  ulong uVar2;
  
  vPath = Vec_IntAlloc(p->nLevels);
  uVar1 = *(ulong *)pObj & 0x1fffffff;
  uVar2 = 0;
  if (uVar1 != 0x1fffffff) {
    uVar2 = -uVar1;
  }
  Gia_ManCollectPath_rec(p,pObj + (uVar2 & (long)(int)*(ulong *)pObj >> 0x1f),vPath);
  return vPath;
}

Assistant:

Vec_Int_t * Gia_ManCollectPath( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Vec_Int_t * vPath = Vec_IntAlloc( p->nLevels );
    Gia_ManCollectPath_rec( p, Gia_ObjIsCo(pObj) ? Gia_ObjFanin0(pObj) : pObj, vPath );
    return vPath;
}